

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_void>
     ::load(iarchive *ar,
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
           *data,uint protocol_version)

{
  error *this;
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  size_t count;
  
  bintoken::iarchive::load<trial::protocol::bintoken::token::begin_array>(ar);
  bintoken::iarchive::load<unsigned_long>(ar,&count);
  if (count == 2) {
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x20) {
      value._M_string_length = 0;
      value.field_2._M_local_buf[0] = '\0';
      value._M_dataplus._M_p = (pointer)&value.field_2;
      bintoken::iarchive::load<std::__cxx11::string>(ar,&value);
      std::__cxx11::string::_M_assign((string *)((long)&data->_M_elems[0]._M_dataplus._M_p + lVar1))
      ;
      std::__cxx11::string::~string((string *)&value);
    }
    if ((ar->reader).decoder.current.code == end_array) {
      bintoken::iarchive::load<trial::protocol::bintoken::token::end_array>(ar);
      return;
    }
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,expected_end_array);
  }
  else {
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,incompatible_type);
  }
  __cxa_throw(this,&bintoken::error::typeinfo,std::system_error::~system_error);
}

Assistant:

static void load(protocol::bintoken::iarchive& ar,
                     std::array<T, N>& data,
                     const unsigned int protocol_version)
    {
        ar.load<bintoken::token::begin_array>();

        std::size_t count;
        ar.load_override(count, protocol_version);
        if (count != N)
            throw bintoken::error(bintoken::incompatible_type);

        for (std::size_t i = 0; i < N; ++i)
        {
            T value;
            ar >> value;
            data[i] = value;
        }
        if (!ar.at<bintoken::token::end_array>())
            throw bintoken::error(bintoken::expected_end_array);
        ar.load<bintoken::token::end_array>();
    }